

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetInputRecordTest_Test::TestBody(Psbt_SetInputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  reference pvVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint *puVar9;
  size_type sVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  ByteData get_gval2;
  ByteData get_gval1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  Transaction get_tx2;
  Transaction get_tx1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  KeyData get_val2;
  KeyData get_val1;
  Psbt psbt2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *except_1;
  AssertionResult gtest_ar;
  CfdException *except;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txin_key_bytes;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  bool *in_stack_ffffffffffffead8;
  KeyData *in_stack_ffffffffffffeae0;
  undefined7 in_stack_ffffffffffffeae8;
  undefined1 in_stack_ffffffffffffeaef;
  allocator_type *in_stack_ffffffffffffeaf0;
  undefined7 in_stack_ffffffffffffeaf8;
  undefined1 in_stack_ffffffffffffeaff;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffeb00;
  AssertHelper local_1350;
  Message local_1348;
  string local_1340 [32];
  AssertionResult local_1320;
  AssertHelper local_1310;
  Message local_1308;
  string local_1300 [32];
  string local_12e0 [32];
  AssertionResult local_12c0;
  AssertHelper local_12b0;
  Message local_12a8;
  string local_12a0 [32];
  string local_1280 [32];
  AssertionResult local_1260;
  AssertHelper local_1250;
  Message local_1248;
  size_type local_1240;
  undefined4 local_1234;
  AssertionResult local_1230;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1220;
  AssertHelper local_1208;
  Message local_1200;
  string local_11f8 [32];
  string local_11d8 [32];
  AssertionResult local_11b8;
  AssertHelper local_11a8;
  Message local_11a0;
  string local_1198 [32];
  string local_1178 [32];
  AssertionResult local_1158;
  undefined1 local_1148 [24];
  undefined1 local_1130 [24];
  ByteData local_1118;
  Psbt local_1100;
  string local_1080;
  AssertHelper local_1060;
  Message local_1058;
  byte local_1049;
  AssertionResult local_1048;
  string local_1038;
  AssertHelper local_1018;
  Message local_1010;
  byte local_1001;
  AssertionResult local_1000;
  string local_ff0;
  AssertHelper local_fd0;
  Message local_fc8;
  byte local_fb9;
  AssertionResult local_fb8;
  allocator local_fa1;
  string local_fa0 [32];
  ByteData local_f80;
  allocator local_f61;
  string local_f60 [39];
  allocator local_f39;
  string local_f38 [32];
  ByteData local_f18;
  allocator local_ef9;
  string local_ef8 [32];
  ByteData local_ed8;
  allocator local_eb9;
  string local_eb8 [39];
  allocator local_e91;
  string local_e90 [32];
  ByteData local_e70;
  AssertHelper local_e58;
  Message local_e50;
  string local_e48 [32];
  AssertionResult local_e28;
  AssertHelper local_e18;
  Message local_e10;
  string local_e08 [32];
  AssertionResult local_de8;
  undefined1 local_dd8 [64];
  undefined1 local_d98 [64];
  AssertHelper local_d58;
  Message local_d50;
  string local_d48 [32];
  string local_d28 [32];
  AssertionResult local_d08;
  AssertHelper local_cf8;
  Message local_cf0;
  string local_ce8 [32];
  string local_cc8 [32];
  AssertionResult local_ca8;
  undefined1 local_c98 [336];
  undefined1 local_b48 [336];
  ByteData local_9f8;
  Psbt local_9e0;
  AssertHelper local_960;
  Message local_958;
  string local_950 [32];
  AssertionResult local_930;
  AssertHelper local_920;
  Message local_918 [4];
  string local_8f8 [32];
  AssertionResult local_8d8 [3];
  Transaction local_8a0 [95];
  allocator local_841;
  string local_840 [32];
  ByteData local_820;
  allocator local_801;
  string local_800 [32];
  ByteData local_7e0;
  allocator local_7c1;
  string local_7c0 [32];
  ByteData local_7a0 [2];
  allocator local_759;
  string local_758 [32];
  ByteData local_738;
  allocator local_719;
  string local_718 [32];
  ByteData local_6f8;
  allocator local_6d9;
  string local_6d8 [32];
  ByteData local_6b8;
  allocator local_699;
  string local_698 [32];
  ByteData local_678;
  Transaction local_660 [95];
  allocator local_601;
  string local_600 [32];
  ByteData local_5e0;
  ByteData local_5c8;
  ByteData local_5b0;
  ByteData local_598;
  ByteData local_580;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_568;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_550 [11];
  vector local_448 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  undefined1 local_410 [336];
  undefined1 local_2c0 [343];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  ByteData local_120;
  HDWallet local_108 [24];
  ByteData local_f0;
  HDWallet local_d8 [47];
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_a9);
  cfd::Psbt::Psbt(&local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x267a1d);
  cfd::core::ByteData::ByteData(&local_120,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x267a57);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"44h/0h/0h/1/1",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"44h/0h/0h/0/1",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_2c0,(string *)local_d8);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_410,(string *)local_108);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x267b34);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
             ,in_stack_ffffffffffffeaf0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x267b5d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267b6a);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_428,0);
  *pvVar6 = '\x06';
  cfd::core::KeyData::GetPubkey();
  cfd::core::Pubkey::GetData();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x267bd0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x267bdd);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Pubkey::GetData();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x267c2f);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x267c3c);
  cfd::core::KeyData::GetFingerprint();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x267c77);
  cfd::core::KeyData::GetFingerprint();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x267cb2);
  cfd::core::KeyData::GetChildNumArray();
  cfd::core::KeyData::GetChildNumArray();
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_428,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267d07);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_550);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267d5f);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267d74);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267d90);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x267db1);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_550);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_580,(vector *)&local_428);
  cfd::core::ByteData::ByteData(&local_598,local_448);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_428,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267e37);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_568);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffeb00,CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267e8f);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267ea4);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x267ec0);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x267ee1);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_568);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_5b0,(vector *)&local_428);
  cfd::core::ByteData::ByteData(&local_5c8,local_448);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"00",&local_601);
  cfd::core::ByteData::ByteData(&local_5e0,local_600);
  cfd::core::Transaction::Transaction(local_660,(string *)&g_psbt_utxo_witness_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData();
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_5e0);
  cfd::core::ByteData::~ByteData((ByteData *)0x267fe5);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x267fff);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"01",&local_699);
  cfd::core::ByteData::ByteData(&local_678,local_698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6d8,"00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787",&local_6d9
            );
  cfd::core::ByteData::ByteData(&local_6b8,local_6d8);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_678);
  cfd::core::ByteData::~ByteData((ByteData *)0x2680db);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  cfd::core::ByteData::~ByteData((ByteData *)0x268102);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"03",&local_719);
  cfd::core::ByteData::ByteData(&local_6f8,local_718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"01000000",&local_759);
  cfd::core::ByteData::ByteData(&local_738,local_758);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_6f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2681de);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  cfd::core::ByteData::~ByteData((ByteData *)0x268205);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c0,"04",&local_7c1);
  cfd::core::ByteData::ByteData(local_7a0,local_7c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"0014962c4e08f336d3afbc3415c9d359ae1040470520",&local_801);
  cfd::core::ByteData::ByteData(&local_7e0,local_800);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,local_7a0);
  cfd::core::ByteData::~ByteData((ByteData *)0x2689f8);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  cfd::core::ByteData::~ByteData((ByteData *)0x268a1f);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_580);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"00",&local_841);
  cfd::core::ByteData::ByteData(&local_820,local_840);
  cfd::core::Transaction::Transaction(local_8a0,(string *)&g_psbt_utxo_legacy_abi_cxx11_);
  cfd::core::AbstractTransaction::GetData();
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x1,&local_820);
  cfd::core::ByteData::~ByteData((ByteData *)0x268b02);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x268b1c);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x1,&local_5b0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_8d8,
             "\"70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000"
             ,pcVar11);
  std::__cxx11::string::~string(local_8f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x268f32);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(local_8d8);
  if (!bVar4) {
    testing::Message::Message(local_918);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x268ff4);
    testing::internal::AssertHelper::AssertHelper
              (&local_920,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x574,pcVar11);
    testing::internal::AssertHelper::operator=(&local_920,local_918);
    testing::internal::AssertHelper::~AssertHelper(&local_920);
    testing::Message::~Message((Message *)0x269057);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2690af);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_930,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string(local_950);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_930);
  if (!bVar4) {
    testing::Message::Message(&local_958);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x26919c);
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x575,pcVar11);
    testing::internal::AssertHelper::operator=(&local_960,&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    testing::Message::~Message((Message *)0x2691ff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269257);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_9e0,&local_9f8);
  cfd::core::ByteData::~ByteData((ByteData *)0x269292);
  cfd::core::Psbt::GetTxInKeyData((uint)local_b48,SUB81(&local_9e0,0));
  cfd::core::Psbt::GetTxInKeyData((uint)local_c98,SUB81(&local_9e0,0));
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_cc8,0),(HardenedType)local_b48,true);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_ce8,0),(HardenedType)local_2c0,true);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_ce8);
  std::__cxx11::string::~string(local_cc8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_ca8);
  if (!bVar4) {
    testing::Message::Message(&local_cf0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x269482);
    testing::internal::AssertHelper::AssertHelper
              (&local_cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_cf8,&local_cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_cf8);
    testing::Message::~Message((Message *)0x2694e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26953d);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_d28,0),(HardenedType)local_c98,true);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_d48,0),(HardenedType)local_410,true);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_d48);
  std::__cxx11::string::~string(local_d28);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_d08);
  if (!bVar4) {
    testing::Message::Message(&local_d50);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x269680);
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    testing::Message::~Message((Message *)0x2696e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26973b);
  cfd::core::Psbt::GetTxInUtxoFull((uint)local_d98,SUB81(&local_9e0,0),(bool *)0x0);
  cfd::core::Psbt::GetTxInUtxoFull((uint)local_dd8,SUB81(&local_9e0,0),(bool *)0x1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_e08);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_de8);
  if (!bVar4) {
    testing::Message::Message(&local_e10);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x269894);
    testing::internal::AssertHelper::AssertHelper
              (&local_e18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x57f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e18,&local_e10);
    testing::internal::AssertHelper::~AssertHelper(&local_e18);
    testing::Message::~Message((Message *)0x2698f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26994f);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_e48);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_e28);
  if (!bVar4) {
    testing::Message::Message(&local_e50);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x269a34);
    testing::internal::AssertHelper::AssertHelper
              (&local_e58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x580,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e58,&local_e50);
    testing::internal::AssertHelper::~AssertHelper(&local_e58);
    testing::Message::~Message((Message *)0x269a97);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x269aef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e90,"cfd",&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"dummy1",&local_eb9);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_e70,(string *)0xfc,(uchar)local_e90,(string *)0x0);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::~string(local_e90);
  std::allocator<char>::~allocator((allocator<char> *)&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ef8,"01020304",&local_ef9);
  cfd::core::ByteData::ByteData(&local_ed8,local_ef8);
  std::__cxx11::string::~string(local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"cfd",&local_f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f60,"dummy2",&local_f61);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_f18,(string *)0xfc,(uchar)local_f38,(string *)0x0);
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fa0,"00",&local_fa1);
  cfd::core::ByteData::ByteData(&local_f80,local_fa0);
  std::__cxx11::string::~string(local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_e70);
  local_fb9 = cfd::core::Psbt::IsFindTxInRecord((uint)&local_88,(ByteData *)0x0);
  local_fb9 = local_fb9 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,(type *)0x269d89
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_fb8);
  if (!bVar4) {
    testing::Message::Message(&local_fc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ff0,(internal *)&local_fb8,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x587,pcVar11);
    testing::internal::AssertHelper::operator=(&local_fd0,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_fd0);
    std::__cxx11::string::~string((string *)&local_ff0);
    testing::Message::~Message((Message *)0x26a021);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a099);
  bVar5 = cfd::core::Psbt::IsFindTxInRecord((uint)&local_88,(ByteData *)0x0);
  local_1001 = ~bVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,(type *)0x26a0de
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1000);
  if (!bVar4) {
    testing::Message::Message(&local_1010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1038,(internal *)&local_1000,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x588,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    testing::Message::~Message((Message *)0x26a1d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a251);
  cfd::core::Psbt::SetTxInRecord((uint)&local_88,(ByteData *)0x0,&local_f18);
  local_1049 = cfd::core::Psbt::IsFindTxInRecord((uint)&local_88,(ByteData *)0x0);
  local_1049 = local_1049 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,(type *)0x26a2b5
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1048);
  if (!bVar4) {
    testing::Message::Message(&local_1058);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1080,(internal *)&local_1048,
               (AssertionResult *)"psbt.IsFindTxInRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1060,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x58a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1060,&local_1058);
    testing::internal::AssertHelper::~AssertHelper(&local_1060);
    std::__cxx11::string::~string((string *)&local_1080);
    testing::Message::~Message((Message *)0x26a3ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a428);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_1100,&local_1118);
  cfd::Psbt::operator=(&local_9e0,&local_1100);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x26a487);
  cfd::core::Psbt::GetTxInRecord((uint)local_1130,(ByteData *)&local_9e0);
  cfd::core::Psbt::GetTxInRecord((uint)local_1148,(ByteData *)&local_9e0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_1198);
  std::__cxx11::string::~string(local_1178);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1158);
  if (!bVar4) {
    testing::Message::Message(&local_11a0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x26a66e);
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x58f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    testing::Message::~Message((Message *)0x26a6cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a723);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_11f8);
  std::__cxx11::string::~string(local_11d8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_11b8);
  if (!bVar4) {
    testing::Message::Message(&local_1200);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x26a84a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x590,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1208,&local_1200);
    testing::internal::AssertHelper::~AssertHelper(&local_1208);
    testing::Message::~Message((Message *)0x26a8a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26a8ff);
  cfd::core::Psbt::GetTxInRecordKeyList((uint)&local_1220);
  local_1234 = 2;
  local_1240 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1220);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
             (char *)in_stack_ffffffffffffeaf0,
             (int *)CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
             (unsigned_long *)in_stack_ffffffffffffeae0);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1230);
  if (!bVar4) {
    testing::Message::Message(&local_1248);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x26a9e7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x593,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1250,&local_1248);
    testing::internal::AssertHelper::~AssertHelper(&local_1250);
    testing::Message::~Message((Message *)0x26aa44);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26aa9c);
  sVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1220)
  ;
  if (sVar10 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1220,0);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
               (char *)in_stack_ffffffffffffeaf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeae0);
    std::__cxx11::string::~string(local_12a0);
    std::__cxx11::string::~string(local_1280);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1260);
    if (!bVar4) {
      testing::Message::Message(&local_12a8);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x26abe6);
      testing::internal::AssertHelper::AssertHelper
                (&local_12b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x595,pcVar11);
      testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
      testing::internal::AssertHelper::~AssertHelper(&local_12b0);
      testing::Message::~Message((Message *)0x26ac43);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26ac9b);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1220,1);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffeaff,in_stack_ffffffffffffeaf8),
               (char *)in_stack_ffffffffffffeaf0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffeaef,in_stack_ffffffffffffeae8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeae0);
    std::__cxx11::string::~string(local_1300);
    std::__cxx11::string::~string(local_12e0);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_12c0);
    if (!bVar4) {
      testing::Message::Message(&local_1308);
      in_stack_ffffffffffffeaf0 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x26adcf);
      testing::internal::AssertHelper::AssertHelper
                (&local_1310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x596,(char *)in_stack_ffffffffffffeaf0);
      testing::internal::AssertHelper::operator=(&local_1310,&local_1308);
      testing::internal::AssertHelper::~AssertHelper(&local_1310);
      testing::Message::~Message((Message *)0x26ae2c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26ae81);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1320,
             "\"cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA"
             ,pcVar11);
  std::__cxx11::string::~string(local_1340);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1320);
  if (!bVar4) {
    testing::Message::Message(&local_1348);
    in_stack_ffffffffffffeae0 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x26af6a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x598,(char *)in_stack_ffffffffffffeae0);
    testing::internal::AssertHelper::operator=(&local_1350,&local_1348);
    testing::internal::AssertHelper::~AssertHelper(&local_1350);
    testing::Message::~Message((Message *)0x26afc7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26b01f);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_ffffffffffffeaf0);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b039);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b046);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b053);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b060);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b06d);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b07a);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b0c8);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b0d5);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b0e2);
  cfd::core::ByteData::~ByteData((ByteData *)0x26b0ef);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffeaf0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffeae0);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x26b198);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x26b1a5);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffeae0);
  return;
}

Assistant:

TEST(Psbt, SetInputRecordTest) {
  Psbt psbt("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/1/1";
  std::string path2 = "44h/0h/0h/0/1";

  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);

  std::vector<uint8_t> txin_key_bytes(34);
  std::vector<uint8_t> txin_val_bytes;
  txin_key_bytes[0] = 6;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txin_key_bytes[1], pk_bytes1.data(), 33);
  txin_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txin_val_bytes.data(), fp1.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txin_key_bytes);
  ByteData txout_value1 = ByteData(txin_val_bytes);

  memcpy(&txin_key_bytes[1], pk_bytes2.data(), 33);
  txin_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txin_val_bytes.data(), fp2.data(), 4);
  memcpy(&txin_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txin_key_bytes);
  ByteData txout_value2 = ByteData(txin_val_bytes);

  psbt.SetTxInRecord(0, ByteData("00"), Transaction(g_psbt_utxo_witness).GetData());
  try {
    psbt.SetTxInRecord(0, ByteData("01"), ByteData("00e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787"));
    psbt.SetTxInRecord(0, ByteData("03"), ByteData("01000000"));
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
  psbt.SetTxInRecord(0, ByteData("04"), ByteData("0014962c4e08f336d3afbc3415c9d359ae1040470520"));
  psbt.SetTxInRecord(0, txout_key1, txout_value1);

  try {
    psbt.SetTxInRecord(1, ByteData("00"), Transaction(g_psbt_utxo_legacy).GetData());
    psbt.SetTxInRecord(1, txout_key2, txout_value2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  EXPECT_STREQ("70736274ff01005c0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0000000000000100f602000000000101f1993fe8e7189542ee4506258e170201be292703cd275acb09ece16672fd848b0000000017160014ac9ef80b27af1c9d95c1db5d761319322bc42fc5ffffffff02080410240100000016001409de2a0431cbb3444fc22cad9d9a0fd09639721000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac975307870247304402201e07df721c3322419e8f36d07eeae4795975ba0d9d19630ca3cd3dc0d4967172022015428e7be06b6567501539050bd791a380f00bbddbc5097ea97ba7be4017114a0121024aef43b1d5ac7ba5014998d63ceac583959d1fdc66ea2699cd84eeaf82a283060000000001012000e1f5050000000017a914509f5985f4e90a14fb90e39316fdb4f3ac97530787010304010000000104160014962c4e08f336d3afbc3415c9d359ae1040470520220602565248460b3c186decf13db06f0724fd50b47cc3e489c30076c8363d5038cefe182a7047602c00008000000080000000800100000001000000000100bf0200000001c6d2ea36e2e802b52ddac665dacbed2f831b5263459e1ca734f5c945d7515e40000000006a473044022011b96c7d2d0d2e8dcb37138e18acc460752965add9cb8787df5c349df0e2ae6602202e93af31b64f5166e5605819555dabec57be794300fadb37052f31dddea9905c012103e3d244a3967e0b87765fda86c5ff38885f74993953b9584388aef30b26af6aecffffffff017851cd1d000000001976a9148d20443a91969e3bca0e240cd0ffe4dc98c63de288ac00000000220602d9f6888f285a15a6a1880a2202c2b230a42d77cf62da6a48aca4198262cda3c7189d6b6d862c0000800000008000000080000000000100000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEAvwIAAAABxtLqNuLoArUt2sZl2svtL4MbUmNFnhynNPXJRddRXkAAAAAAakcwRAIgEblsfS0NLo3LNxOOGKzEYHUpZa3Zy4eH31w0nfDirmYCIC6TrzG2T1Fm5WBYGVVdq+xXvnlDAPrbNwUvMd3eqZBcASED49JEo5Z+C4d2X9qGxf84iF90mTlTuVhDiK7zCyavauz/////AXhRzR0AAAAAGXapFI0gRDqRlp47yg4kDND/5NyYxj3iiKwAAAAAIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAAA==", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxInKeyData(0);
  auto get_val2 = psbt2.GetTxInKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  auto get_tx1 = psbt2.GetTxInUtxoFull(0);
  auto get_tx2 = psbt2.GetTxInUtxoFull(1);
  EXPECT_EQ(get_tx1.GetHex(), g_psbt_utxo_witness);
  EXPECT_EQ(get_tx2.GetHex(), g_psbt_utxo_legacy);

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxInRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxInRecord(0, global_key2));
  psbt.SetTxInRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxInRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxInRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxInRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxInRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAABAPYCAAAAAAEB8Zk/6OcYlULuRQYljhcCAb4pJwPNJ1rLCezhZnL9hIsAAAAAFxYAFKye+AsnrxydlcHbXXYTGTIrxC/F/////wIIBBAkAQAAABYAFAneKgQxy7NET8IsrZ2aD9CWOXIQAOH1BQAAAAAXqRRQn1mF9OkKFPuQ45MW/bTzrJdTB4cCRzBEAiAeB99yHDMiQZ6PNtB+6uR5WXW6DZ0ZYwyjzT3A1JZxcgIgFUKOe+BrZWdQFTkFC9eRo4DwC73bxQl+qXunvkAXEUoBIQJK70Ox1ax7pQFJmNY86sWDlZ0f3GbqJpnNhO6vgqKDBgAAAAABASAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwEDBAEAAAABBBYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAAQC/AgAAAAHG0uo24ugCtS3axmXay+0vgxtSY0WeHKc09clF11FeQAAAAABqRzBEAiARuWx9LQ0ujcs3E44YrMRgdSllrdnLh4ffXDSd8OKuZgIgLpOvMbZPUWblYFgZVV2r7Fe+eUMA+ts3BS8x3d6pkFwBIQPj0kSjln4Lh3Zf2obF/ziIX3SZOVO5WEOIrvMLJq9q7P////8BeFHNHQAAAAAZdqkUjSBEOpGWnjvKDiQM0P/k3JjGPeKIrAAAAAAiBgLZ9oiPKFoVpqGICiICwrIwpC13z2LaakispBmCYs2jxxida22GLAAAgAAAAIAAAACAAAAAAAEAAAAA", psbt2.GetBase64().c_str());
}